

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SequenceRepetitionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SequenceRepetitionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  SequenceRepetitionSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openBracket).kind;
    token._2_1_ = (this->openBracket).field_0x2;
    token.numFlags.raw = (this->openBracket).numFlags.raw;
    token.rawLen = (this->openBracket).rawLen;
    token.info = (this->openBracket).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->op).kind;
    token_00._2_1_ = (this->op).field_0x2;
    token_00.numFlags.raw = (this->op).numFlags.raw;
    token_00.rawLen = (this->op).rawLen;
    token_00.info = (this->op).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->selector->super_SyntaxNode)
    ;
    break;
  case 3:
    token_01.kind = (this->closeBracket).kind;
    token_01._2_1_ = (this->closeBracket).field_0x2;
    token_01.numFlags.raw = (this->closeBracket).numFlags.raw;
    token_01.rawLen = (this->closeBracket).rawLen;
    token_01.info = (this->closeBracket).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SequenceRepetitionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBracket;
        case 1: return op;
        case 2: return selector;
        case 3: return closeBracket;
        default: return nullptr;
    }
}